

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadAnimationLibrary(ColladaParser *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string local_40;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if (((char)iVar1 == '\0') &&
     (iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (char)iVar1 != '\0')) {
    do {
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar1 == 1) {
        if (iVar2 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"animation");
        if (iVar1 == 0) {
          ReadAnimation(this,&this->mAnims);
        }
        else {
          SkipElement(this);
        }
      }
      else if (iVar2 == 2) {
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var_00,iVar1),"library_animations");
        if (iVar1 == 0) {
          return;
        }
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Expected end of <library_animations> element.","");
        ThrowException(this,&local_40);
      }
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar1 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadAnimationLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("animation"))
            {
                // delegate the reading. Depending on the inner elements it will be a container or a anim channel
                ReadAnimation(&mAnims);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "library_animations") != 0)
                ThrowException("Expected end of <library_animations> element.");

            break;
        }
    }
}